

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleFindCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  long lVar4;
  pointer pbVar5;
  char *local_1c0 [4];
  ostringstream s;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pbVar3 - (long)pbVar5 >> 5) - 6U < 0xfffffffffffffffe) {
    std::__cxx11::string::string
              ((string *)&s,"sub-command FIND requires 3 or 4 parameters.",(allocator *)local_1c0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&s);
LAB_002ccfc5:
    std::__cxx11::string::~string((string *)&s);
    bVar2 = false;
  }
  else {
    if ((long)pbVar3 - (long)pbVar5 == 0xa0) {
      bVar1 = std::operator==(pbVar5 + 4,"REVERSE");
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar1 = false;
    }
    if ((long)pbVar3 - (long)pbVar5 == 0xa0) {
      bVar2 = std::operator!=(pbVar5 + 4,"REVERSE");
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&s,"sub-command FIND: unknown last parameter",(allocator *)local_1c0);
        cmCommand::SetError(&this->super_cmCommand,(string *)&s);
        goto LAB_002ccfc5;
      }
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    __lhs = pbVar5 + 3;
    bVar2 = std::operator==(__lhs,"REVERSE");
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&s,
                 "sub-command FIND does not allow to select REVERSE as the output variable.  Maybe you missed the actual output variable?"
                 ,(allocator *)local_1c0);
      cmCommand::SetError(&this->super_cmCommand,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      if (bVar1 == false) {
        lVar4 = std::__cxx11::string::find((string *)(pbVar5 + 1),(ulong)(pbVar5 + 2));
      }
      else {
        lVar4 = std::__cxx11::string::rfind((string *)(pbVar5 + 1),(ulong)(pbVar5 + 2));
      }
      if (lVar4 == -1) {
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,__lhs,"-1");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::_M_insert<unsigned_long>((ulong)&s);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(this_00,__lhs,local_1c0[0]);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      }
    }
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool cmStringCommand::HandleFindCommand(std::vector<std::string> const&
                                           args)
{
  // check if all required parameters were passed
  if(args.size() < 4 || args.size() > 5)
    {
    this->SetError("sub-command FIND requires 3 or 4 parameters.");
    return false;
    }

  // check if the reverse flag was set or not
  bool reverseMode = false;
  if(args.size() == 5 && args[4] == "REVERSE")
    {
    reverseMode = true;
    }

  // if we have 5 arguments the last one must be REVERSE
  if(args.size() == 5 && args[4] != "REVERSE")
    {
    this->SetError("sub-command FIND: unknown last parameter");
    return false;
    }

  // local parameter names.
  const std::string& sstring = args[1];
  const std::string& schar = args[2];
  const std::string& outvar = args[3];

  // ensure that the user cannot accidentally specify REVERSE as a variable
  if(outvar == "REVERSE")
    {
    this->SetError("sub-command FIND does not allow to select REVERSE as "
                   "the output variable.  "
                   "Maybe you missed the actual output variable?");
    return false;
    }

  // try to find the character and return its position
  size_t pos;
  if(!reverseMode)
    {
    pos = sstring.find(schar);
    }
  else
    {
    pos = sstring.rfind(schar);
    }
  if(std::string::npos != pos)
    {
    std::ostringstream s;
    s << pos;
    this->Makefile->AddDefinition(outvar, s.str().c_str());
    return true;
    }

  // the character was not found, but this is not really an error
  this->Makefile->AddDefinition(outvar, "-1");
  return true;
}